

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O0

void rb_remove_node(lyd_meta *root_meta,rb_node **rbt,lyd_node *node,rb_node **removed)

{
  rb_node *prVar1;
  lyd_value_lyds_tree *_lt;
  rb_node *rbn;
  rb_node **removed_local;
  lyd_node *node_local;
  rb_node **rbt_local;
  lyd_meta *root_meta_local;
  
  if (((root_meta != (lyd_meta *)0x0) && (rbt != (rb_node **)0x0)) && (node != (lyd_node *)0x0)) {
    if ((*rbt != (rb_node *)0x0) && (prVar1 = rb_find(*rbt,node), prVar1 != (rb_node *)0x0)) {
      if (prVar1->dnode != node) {
        __assert_fail("RBN_DNODE(rbn) == node",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                      ,0x3ca,
                      "void rb_remove_node(struct lyd_meta *, struct rb_node **, struct lyd_node *, struct rb_node **)"
                     );
      }
      prVar1 = rb_remove(rbt,prVar1);
      *removed = prVar1;
      if (prVar1 == *rbt) {
        *rbt = (rb_node *)0x0;
      }
      (root_meta->value).field_2.enum_item = (lysc_type_bitenum_item *)*rbt;
    }
    return;
  }
  __assert_fail("root_meta && rbt && node",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                ,0x3be,
                "void rb_remove_node(struct lyd_meta *, struct rb_node **, struct lyd_node *, struct rb_node **)"
               );
}

Assistant:

static void
rb_remove_node(struct lyd_meta *root_meta, struct rb_node **rbt, struct lyd_node *node, struct rb_node **removed)
{
    struct rb_node *rbn;

    assert(root_meta && rbt && node);

    if (!*rbt) {
        return;
    }

    /* find @p node in the Red-black tree. */
    rbn = rb_find(*rbt, node);
    if (!rbn) {
        /* node was not inserted to the lyds tree due to optimization */
        return;
    }
    assert(RBN_DNODE(rbn) == node);

    /* remove node */
    rbn = rb_remove(rbt, rbn);
    *removed = rbn;
    if (rbn == *rbt) {
        /* rbn was the last node, assurance that root will be set to NULL */
        *rbt = NULL;
    }

    /* the root of the Red-black tree may changed due to removal, so update the pointer to the root */
    RBT_SET(root_meta, *rbt);
}